

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void cmsysProcess_SetOption(cmsysProcess *cp,int optionId,int value)

{
  int value_local;
  int optionId_local;
  cmsysProcess *cp_local;
  
  if (cp != (cmsysProcess *)0x0) {
    if (optionId == 1) {
      cp->OptionDetach = value;
    }
    else if (optionId == 2) {
      cp->MergeOutput = value;
    }
    else if (optionId == 3) {
      cp->Verbatim = value;
    }
  }
  return;
}

Assistant:

void kwsysProcess_SetOption(kwsysProcess* cp, int optionId, int value)
{
  if(!cp)
    {
    return;
    }

  switch(optionId)
    {
    case kwsysProcess_Option_Detach: cp->OptionDetach = value; break;
    case kwsysProcess_Option_MergeOutput: cp->MergeOutput = value; break;
    case kwsysProcess_Option_Verbatim: cp->Verbatim = value; break;
    default: break;
    }
}